

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_var(JSParseState *s,int parse_flags,int tok,BOOL export_flag)

{
  uint uVar1;
  JSAtom name;
  JSContext *ctx;
  JSAtomStruct *pJVar2;
  int iVar3;
  JSExportEntry *pJVar4;
  uint8_t val;
  char *fmt;
  int opcode;
  undefined2 local_52;
  int local_50;
  JSAtom name1;
  JSFunctionDef *local_48;
  uint local_3c;
  int label;
  int scope;
  
  ctx = s->ctx;
  local_48 = s->cur_func;
  local_3c = (uint)(byte)(((tok + 0x37U & 0xfffffff7) == 0) * '\x04' + 0xb7);
  local_50 = parse_flags;
  do {
    uVar1 = (s->token).val;
    if (uVar1 == 0xffffff83) {
      if ((s->token).u.ident.is_reserved != 0) {
        js_parse_error_reserved_identifier(s);
        return -1;
      }
      name = (s->token).u.ident.atom;
      if (0xd1 < (long)(int)name) {
        pJVar2 = ctx->rt->atom_array[(int)name];
        (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
      }
      if ((name == 0x27) && ((tok == -0x2f || (tok == -0x37)))) {
        fmt = "\'let\' is not a valid lexical identifier";
LAB_0015f6ee:
        js_parse_error(s,fmt);
LAB_0015f6f8:
        JS_FreeAtom(ctx,name);
        return -1;
      }
      iVar3 = next_token(s);
      if ((iVar3 != 0) ||
         ((iVar3 = js_define_var(s,name,tok), iVar3 != 0 ||
          ((export_flag != 0 &&
           (pJVar4 = add_export_entry2(s->ctx,s,s->cur_func->module,name,name,JS_EXPORT_TYPE_LOCAL),
           pJVar4 == (JSExportEntry *)0x0)))))) goto LAB_0015f6f8;
      if ((s->token).val == 0x3d) {
        iVar3 = next_token(s);
        if (iVar3 != 0) goto LAB_0015f6f8;
        if (tok != -0x4f) {
          iVar3 = js_parse_assign_expr2(s,local_50);
          if (iVar3 != 0) goto LAB_0015f6f8;
          set_object_name(s,name);
          val = (uint8_t)local_3c;
          goto LAB_0015f669;
        }
        emit_op(s,0xb6);
        emit_atom(s,name);
        local_52 = (undefined2)local_48->scope_level;
        dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_52,2);
        iVar3 = get_lvalue(s,&opcode,&scope,&name1,&label,(int *)0x0,0,0x3d);
        if (iVar3 < 0) goto LAB_0015f6f8;
        iVar3 = js_parse_assign_expr2(s,local_50);
        if (iVar3 != 0) {
          JS_FreeAtom(ctx,name1);
          goto LAB_0015f6f8;
        }
        set_object_name(s,name);
        put_lvalue(s,opcode,scope,name1,label,PUT_LVALUE_NOKEEP,0);
      }
      else {
        if (tok != -0x2f) {
          if (tok != -0x37) goto LAB_0015f6a2;
          fmt = "missing initializer for const variable";
          goto LAB_0015f6ee;
        }
        emit_op(s,'\x06');
        val = 0xbb;
LAB_0015f669:
        emit_op(s,val);
        emit_atom(s,name);
        opcode = CONCAT22(opcode._2_2_,(short)local_48->scope_level);
        dbuf_put(&s->cur_func->byte_code,(uint8_t *)&opcode,2);
      }
LAB_0015f6a2:
      JS_FreeAtom(ctx,name);
    }
    else {
      if (((uVar1 | 0x20) != 0x7b) ||
         (iVar3 = js_parse_skip_parens_token(s,&opcode,0), iVar3 != 0x3d)) {
        js_parse_error(s,"variable name expected");
        return -1;
      }
      emit_op(s,'\x06');
      iVar3 = js_parse_destructuring_element(s,tok,0,1,opcode & 2,1);
      if (iVar3 < 0) {
        return -1;
      }
    }
    if ((s->token).val != 0x2c) {
      return 0;
    }
    iVar3 = next_token(s);
    if (iVar3 != 0) {
      return -1;
    }
  } while( true );
}

Assistant:

static __exception int js_parse_var(JSParseState *s, int parse_flags, int tok,
                                    BOOL export_flag)
{
    JSContext *ctx = s->ctx;
    JSFunctionDef *fd = s->cur_func;
    JSAtom name = JS_ATOM_NULL;

    for (;;) {
        if (s->token.val == TOK_IDENT) {
            if (s->token.u.ident.is_reserved) {
                return js_parse_error_reserved_identifier(s);
            }
            name = JS_DupAtom(ctx, s->token.u.ident.atom);
            if (name == JS_ATOM_let && (tok == TOK_LET || tok == TOK_CONST)) {
                js_parse_error(s, "'let' is not a valid lexical identifier");
                goto var_error;
            }
            if (next_token(s))
                goto var_error;
            if (js_define_var(s, name, tok))
                goto var_error;
            if (export_flag) {
                if (!add_export_entry(s, s->cur_func->module, name, name,
                                      JS_EXPORT_TYPE_LOCAL))
                    goto var_error;
            }

            if (s->token.val == '=') {
                if (next_token(s))
                    goto var_error;
                if (tok == TOK_VAR) {
                    /* Must make a reference for proper `with` semantics */
                    int opcode, scope, label;
                    JSAtom name1;

                    emit_op(s, OP_scope_get_var);
                    emit_atom(s, name);
                    emit_u16(s, fd->scope_level);
                    if (get_lvalue(s, &opcode, &scope, &name1, &label, NULL, FALSE, '=') < 0)
                        goto var_error;
                    if (js_parse_assign_expr2(s, parse_flags)) {
                        JS_FreeAtom(ctx, name1);
                        goto var_error;
                    }
                    set_object_name(s, name);
                    put_lvalue(s, opcode, scope, name1, label,
                               PUT_LVALUE_NOKEEP, FALSE);
                } else {
                    if (js_parse_assign_expr2(s, parse_flags))
                        goto var_error;
                    set_object_name(s, name);
                    emit_op(s, (tok == TOK_CONST || tok == TOK_LET) ?
                        OP_scope_put_var_init : OP_scope_put_var);
                    emit_atom(s, name);
                    emit_u16(s, fd->scope_level);
                }
            } else {
                if (tok == TOK_CONST) {
                    js_parse_error(s, "missing initializer for const variable");
                    goto var_error;
                }
                if (tok == TOK_LET) {
                    /* initialize lexical variable upon entering its scope */
                    emit_op(s, OP_undefined);
                    emit_op(s, OP_scope_put_var_init);
                    emit_atom(s, name);
                    emit_u16(s, fd->scope_level);
                }
            }
            JS_FreeAtom(ctx, name);
        } else {
            int skip_bits;
            if ((s->token.val == '[' || s->token.val == '{')
            &&  js_parse_skip_parens_token(s, &skip_bits, FALSE) == '=') {
                emit_op(s, OP_undefined);
                if (js_parse_destructuring_element(s, tok, 0, TRUE, skip_bits & SKIP_HAS_ELLIPSIS, TRUE) < 0)
                    return -1;
            } else {
                return js_parse_error(s, "variable name expected");
            }
        }
        if (s->token.val != ',')
            break;
        if (next_token(s))
            return -1;
    }
    return 0;

 var_error:
    JS_FreeAtom(ctx, name);
    return -1;
}